

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdhuff.c
# Opt level: O1

boolean decode_mcu_sub(j_decompress_ptr cinfo,JBLOCKROW *MCU_data)

{
  jpeg_entropy_decoder *pjVar1;
  d_derived_tbl *pdVar2;
  jpeg_source_mgr *pjVar3;
  bool bVar4;
  boolean bVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  uint unaff_R12D;
  uint uVar9;
  int iVar10;
  int bits_left;
  int iVar11;
  int iVar12;
  _func_void_j_decompress_ptr *p_Var13;
  _func_void_j_decompress_ptr *get_buffer;
  bitread_working_state br_state;
  savable_state state;
  bitread_working_state local_a0;
  j_decompress_ptr local_78;
  int local_70;
  int local_6c;
  jpeg_entropy_decoder *local_68;
  JBLOCKROW local_60;
  undefined8 local_58;
  _func_boolean_j_decompress_ptr_JBLOCKROW_ptr *p_Stack_50;
  undefined4 local_48;
  int *local_40;
  JBLOCKROW *local_38;
  
  local_38 = MCU_data;
  pjVar1 = cinfo->entropy;
  local_78 = cinfo;
  if (((cinfo->restart_interval == 0) || (*(int *)&pjVar1[3].decode_mcu != 0)) ||
     (bVar5 = process_restart(cinfo), bVar5 != 0)) {
    local_68 = pjVar1;
    if (*(int *)((long)&pjVar1[3].start_pass + 4) == 0) {
      local_40 = local_78->natural_order;
      local_6c = local_78->lim_Se;
      local_a0.cinfo = local_78;
      local_a0.next_input_byte = local_78->src->next_input_byte;
      local_a0.bytes_in_buffer = local_78->src->bytes_in_buffer;
      get_buffer = pjVar1[1].start_pass;
      bits_left = *(int *)&pjVar1[1].decode_mcu;
      local_48 = *(undefined4 *)&pjVar1[3].start_pass;
      local_58 = pjVar1[2].start_pass;
      p_Stack_50 = pjVar1[2].decode_mcu;
      if (0 < local_78->blocks_in_MCU) {
        lVar8 = 0;
        do {
          local_60 = local_38[lVar8];
          pdVar2 = (d_derived_tbl *)(&local_68[10].decode_mcu)[lVar8];
          if (bits_left < 8) {
            bVar4 = false;
            bVar5 = jpeg_fill_bit_buffer(&local_a0,(bit_buf_type)get_buffer,bits_left,0);
            if (bVar5 != 0) {
              iVar10 = 1;
              get_buffer = (_func_void_j_decompress_ptr *)local_a0.get_buffer;
              bits_left = local_a0.bits_left;
              if (7 < local_a0.bits_left) goto LAB_00111615;
              goto LAB_00111645;
            }
          }
          else {
LAB_00111615:
            uVar6 = (long)get_buffer >> ((char)bits_left - 8U & 0x3f) & 0xff;
            if (pdVar2->look_nbits[uVar6] == 0) {
              iVar10 = 9;
LAB_00111645:
              unaff_R12D = jpeg_huff_decode(&local_a0,(bit_buf_type)get_buffer,bits_left,pdVar2,
                                            iVar10);
              if ((int)unaff_R12D < 0) {
                unaff_R12D = 0xffffffff;
                bVar4 = false;
              }
              else {
                bVar4 = true;
                get_buffer = (_func_void_j_decompress_ptr *)local_a0.get_buffer;
                bits_left = local_a0.bits_left;
              }
            }
            else {
              unaff_R12D = (uint)pdVar2->look_sym[uVar6];
              bVar4 = true;
              bits_left = bits_left - pdVar2->look_nbits[uVar6];
            }
          }
          if (bVar4) {
            pdVar2 = (d_derived_tbl *)(&local_68[0xf].decode_mcu)[lVar8];
            local_70 = *(int *)((long)&local_68[0x14].decode_mcu + lVar8 * 4);
            if (local_70 == 0) {
              iVar10 = 1;
              if (unaff_R12D == 0) {
                unaff_R12D = 0;
              }
              else {
                p_Var13 = get_buffer;
                iVar12 = bits_left;
                if ((bits_left < (int)unaff_R12D) &&
                   (bVar5 = jpeg_fill_bit_buffer
                                      (&local_a0,(bit_buf_type)get_buffer,bits_left,unaff_R12D),
                   p_Var13 = (_func_void_j_decompress_ptr *)local_a0.get_buffer,
                   iVar12 = local_a0.bits_left, bVar5 == 0)) {
LAB_001119ba:
                  bVar4 = false;
                  goto LAB_001119da;
                }
                get_buffer = p_Var13;
                bits_left = iVar12 - unaff_R12D;
              }
            }
            else {
              if (unaff_R12D == 0) {
                iVar10 = 0;
              }
              else {
                p_Var13 = get_buffer;
                iVar10 = bits_left;
                if ((bits_left < (int)unaff_R12D) &&
                   (bVar5 = jpeg_fill_bit_buffer
                                      (&local_a0,(bit_buf_type)get_buffer,bits_left,unaff_R12D),
                   p_Var13 = (_func_void_j_decompress_ptr *)local_a0.get_buffer,
                   iVar10 = local_a0.bits_left, bVar5 == 0)) {
                  bVar4 = false;
                  goto LAB_001119da;
                }
                bits_left = iVar10 - unaff_R12D;
                uVar9 = (uint)((long)p_Var13 >> ((byte)bits_left & 0x3f)) & bmask[(int)unaff_R12D];
                uVar7 = bmask[(int)unaff_R12D];
                if (jpeg_zigzag_order[7][(long)(int)unaff_R12D + 7] < (int)uVar9) {
                  uVar7 = 0;
                }
                iVar10 = uVar9 - uVar7;
                get_buffer = p_Var13;
              }
              unaff_R12D = iVar10 + *(int *)((long)&local_58 +
                                            (long)local_78->MCU_membership[lVar8] * 4 + 4);
              *(uint *)((long)&local_58 + (long)local_78->MCU_membership[lVar8] * 4 + 4) =
                   unaff_R12D;
              (*local_60)[0] = (JCOEF)unaff_R12D;
              iVar10 = 1;
              if (1 < local_70) {
                iVar10 = 1;
                do {
                  if (bits_left < 8) {
                    bVar4 = false;
                    bVar5 = jpeg_fill_bit_buffer(&local_a0,(bit_buf_type)get_buffer,bits_left,0);
                    if (bVar5 != 0) {
                      iVar12 = 1;
                      get_buffer = (_func_void_j_decompress_ptr *)local_a0.get_buffer;
                      bits_left = local_a0.bits_left;
                      if (7 < local_a0.bits_left) goto LAB_001117b8;
                      goto LAB_001117e9;
                    }
                  }
                  else {
LAB_001117b8:
                    uVar6 = (long)get_buffer >> ((char)bits_left - 8U & 0x3f) & 0xff;
                    if (pdVar2->look_nbits[uVar6] == 0) {
                      iVar12 = 9;
LAB_001117e9:
                      unaff_R12D = jpeg_huff_decode(&local_a0,(bit_buf_type)get_buffer,bits_left,
                                                    pdVar2,iVar12);
                      if ((int)unaff_R12D < 0) {
                        unaff_R12D = 0xffffffff;
                        bVar4 = false;
                      }
                      else {
                        bVar4 = true;
                        get_buffer = (_func_void_j_decompress_ptr *)local_a0.get_buffer;
                        bits_left = local_a0.bits_left;
                      }
                    }
                    else {
                      unaff_R12D = (uint)pdVar2->look_sym[uVar6];
                      bVar4 = true;
                      bits_left = bits_left - pdVar2->look_nbits[uVar6];
                    }
                  }
                  if (!bVar4) goto LAB_001119ba;
                  iVar12 = (int)unaff_R12D >> 4;
                  uVar7 = unaff_R12D & 0xf;
                  unaff_R12D = unaff_R12D & 0xf;
                  if (uVar7 == 0) {
                    if (iVar12 != 0xf) {
                      bVar4 = true;
                      unaff_R12D = 0;
                      goto LAB_001119da;
                    }
                    iVar10 = iVar10 + 0xf;
                    unaff_R12D = 0;
                  }
                  else {
                    p_Var13 = get_buffer;
                    iVar11 = bits_left;
                    if ((bits_left < (int)unaff_R12D) &&
                       (bVar5 = jpeg_fill_bit_buffer
                                          (&local_a0,(bit_buf_type)get_buffer,bits_left,unaff_R12D),
                       p_Var13 = (_func_void_j_decompress_ptr *)local_a0.get_buffer,
                       iVar11 = local_a0.bits_left, bVar5 == 0)) goto LAB_001119ba;
                    bits_left = iVar11 - unaff_R12D;
                    iVar10 = iVar10 + iVar12;
                    uVar7 = bmask[unaff_R12D];
                    uVar9 = (uint)((long)p_Var13 >> ((byte)bits_left & 0x3f)) & uVar7;
                    if (bmask[unaff_R12D - 1] < (int)uVar9) {
                      uVar7 = 0;
                    }
                    unaff_R12D = uVar9 - uVar7;
                    (*local_60)[local_40[iVar10]] = (JCOEF)unaff_R12D;
                    get_buffer = p_Var13;
                  }
                  iVar10 = iVar10 + 1;
                } while (iVar10 < local_70);
              }
            }
            for (; iVar10 <= local_6c; iVar10 = iVar10 + iVar12 + 1) {
              if (bits_left < 8) {
                bVar4 = false;
                bVar5 = jpeg_fill_bit_buffer(&local_a0,(bit_buf_type)get_buffer,bits_left,0);
                if (bVar5 != 0) {
                  iVar12 = 1;
                  get_buffer = (_func_void_j_decompress_ptr *)local_a0.get_buffer;
                  bits_left = local_a0.bits_left;
                  if (7 < local_a0.bits_left) goto LAB_00111904;
                  goto LAB_00111935;
                }
              }
              else {
LAB_00111904:
                uVar6 = (long)get_buffer >> ((char)bits_left - 8U & 0x3f) & 0xff;
                if (pdVar2->look_nbits[uVar6] == 0) {
                  iVar12 = 9;
LAB_00111935:
                  unaff_R12D = jpeg_huff_decode(&local_a0,(bit_buf_type)get_buffer,bits_left,pdVar2,
                                                iVar12);
                  if ((int)unaff_R12D < 0) {
                    unaff_R12D = 0xffffffff;
                    bVar4 = false;
                  }
                  else {
                    bVar4 = true;
                    get_buffer = (_func_void_j_decompress_ptr *)local_a0.get_buffer;
                    bits_left = local_a0.bits_left;
                  }
                }
                else {
                  unaff_R12D = (uint)pdVar2->look_sym[uVar6];
                  bVar4 = true;
                  bits_left = bits_left - pdVar2->look_nbits[uVar6];
                }
              }
              if (!bVar4) goto LAB_001119ba;
              iVar12 = (int)unaff_R12D >> 4;
              uVar7 = unaff_R12D & 0xf;
              unaff_R12D = unaff_R12D & 0xf;
              if (uVar7 == 0) {
                if (iVar12 != 0xf) {
                  unaff_R12D = 0;
                  break;
                }
                iVar12 = 0xf;
              }
              else {
                p_Var13 = get_buffer;
                iVar11 = bits_left;
                if ((bits_left < (int)unaff_R12D) &&
                   (bVar5 = jpeg_fill_bit_buffer
                                      (&local_a0,(bit_buf_type)get_buffer,bits_left,unaff_R12D),
                   p_Var13 = (_func_void_j_decompress_ptr *)local_a0.get_buffer,
                   iVar11 = local_a0.bits_left, bVar5 == 0)) goto LAB_001119ba;
                bits_left = iVar11 - unaff_R12D;
                get_buffer = p_Var13;
              }
            }
            bVar4 = true;
          }
          else {
            bVar4 = false;
          }
LAB_001119da:
          if (!bVar4) {
            return 0;
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < local_78->blocks_in_MCU);
      }
      pjVar3 = local_78->src;
      pjVar3->next_input_byte = local_a0.next_input_byte;
      pjVar3->bytes_in_buffer = local_a0.bytes_in_buffer;
      local_68[1].start_pass = get_buffer;
      *(int *)&local_68[1].decode_mcu = bits_left;
      *(undefined4 *)&local_68[3].start_pass = local_48;
      local_68[2].start_pass = local_58;
      local_68[2].decode_mcu = p_Stack_50;
    }
    *(int *)&local_68[3].decode_mcu = *(int *)&local_68[3].decode_mcu + -1;
    bVar5 = 1;
  }
  else {
    bVar5 = 0;
  }
  return bVar5;
}

Assistant:

METHODDEF(boolean)
decode_mcu_sub (j_decompress_ptr cinfo, JBLOCKROW *MCU_data)
{
  huff_entropy_ptr entropy = (huff_entropy_ptr) cinfo->entropy;
  const int * natural_order;
  int Se, blkn;
  BITREAD_STATE_VARS;
  savable_state state;

  /* Process restart marker if needed; may have to suspend */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0)
      if (! process_restart(cinfo))
	return FALSE;
  }

  /* If we've run out of data, just leave the MCU set to zeroes.
   * This way, we return uniform gray for the remainder of the segment.
   */
  if (! entropy->insufficient_data) {

    natural_order = cinfo->natural_order;
    Se = cinfo->lim_Se;

    /* Load up working state */
    BITREAD_LOAD_STATE(cinfo,entropy->bitstate);
    ASSIGN_STATE(state, entropy->saved);

    /* Outer loop handles each block in the MCU */

    for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
      JBLOCKROW block = MCU_data[blkn];
      d_derived_tbl * htbl;
      register int s, k, r;
      int coef_limit, ci;

      /* Decode a single block's worth of coefficients */

      /* Section F.2.2.1: decode the DC coefficient difference */
      htbl = entropy->dc_cur_tbls[blkn];
      HUFF_DECODE(s, br_state, htbl, return FALSE, label1);

      htbl = entropy->ac_cur_tbls[blkn];
      k = 1;
      coef_limit = entropy->coef_limit[blkn];
      if (coef_limit) {
	/* Convert DC difference to actual value, update last_dc_val */
	if (s) {
	  CHECK_BIT_BUFFER(br_state, s, return FALSE);
	  r = GET_BITS(s);
	  s = HUFF_EXTEND(r, s);
	}
	ci = cinfo->MCU_membership[blkn];
	s += state.last_dc_val[ci];
	state.last_dc_val[ci] = s;
	/* Output the DC coefficient */
	(*block)[0] = (JCOEF) s;

	/* Section F.2.2.2: decode the AC coefficients */
	/* Since zeroes are skipped, output area must be cleared beforehand */
	for (; k < coef_limit; k++) {
	  HUFF_DECODE(s, br_state, htbl, return FALSE, label2);

	  r = s >> 4;
	  s &= 15;

	  if (s) {
	    k += r;
	    CHECK_BIT_BUFFER(br_state, s, return FALSE);
	    r = GET_BITS(s);
	    s = HUFF_EXTEND(r, s);
	    /* Output coefficient in natural (dezigzagged) order.
	     * Note: the extra entries in natural_order[] will save us
	     * if k > Se, which could happen if the data is corrupted.
	     */
	    (*block)[natural_order[k]] = (JCOEF) s;
	  } else {
	    if (r != 15)
	      goto EndOfBlock;
	    k += 15;
	  }
	}
      } else {
	if (s) {
	  CHECK_BIT_BUFFER(br_state, s, return FALSE);
	  DROP_BITS(s);
	}
      }

      /* Section F.2.2.2: decode the AC coefficients */
      /* In this path we just discard the values */
      for (; k <= Se; k++) {
	HUFF_DECODE(s, br_state, htbl, return FALSE, label3);

	r = s >> 4;
	s &= 15;

	if (s) {
	  k += r;
	  CHECK_BIT_BUFFER(br_state, s, return FALSE);
	  DROP_BITS(s);
	} else {
	  if (r != 15)
	    break;
	  k += 15;
	}
      }

      EndOfBlock: ;
    }

    /* Completed MCU, so update state */
    BITREAD_SAVE_STATE(cinfo,entropy->bitstate);
    ASSIGN_STATE(entropy->saved, state);
  }

  /* Account for restart interval (no-op if not using restarts) */
  entropy->restarts_to_go--;

  return TRUE;
}